

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O0

lzma_index_hash * lzma_index_hash_init(lzma_index_hash *index_hash,lzma_allocator *allocator)

{
  lzma_allocator *allocator_local;
  lzma_index_hash *index_hash_local;
  
  allocator_local = (lzma_allocator *)index_hash;
  if ((index_hash == (lzma_index_hash *)0x0) &&
     (allocator_local = (lzma_allocator *)lzma_alloc(0x140,allocator),
     allocator_local == (lzma_allocator *)0x0)) {
    index_hash_local = (lzma_index_hash *)0x0;
  }
  else {
    *(undefined4 *)&allocator_local->alloc = 0;
    allocator_local->free = (_func_void_void_ptr_void_ptr *)0x0;
    allocator_local->opaque = (void *)0x0;
    allocator_local[1].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    allocator_local[1].free = (_func_void_void_ptr_void_ptr *)0x0;
    allocator_local[6].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    allocator_local[6].free = (_func_void_void_ptr_void_ptr *)0x0;
    allocator_local[6].opaque = (void *)0x0;
    allocator_local[7].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    allocator_local[0xc].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    allocator_local[0xc].free = (_func_void_void_ptr_void_ptr *)0x0;
    allocator_local[0xc].opaque = (void *)0x0;
    *(undefined4 *)&allocator_local[0xd].alloc = 0;
    lzma_check_init((lzma_check_state *)&allocator_local[1].opaque,LZMA_CHECK_SHA256);
    lzma_check_init((lzma_check_state *)&allocator_local[7].free,LZMA_CHECK_SHA256);
    index_hash_local = (lzma_index_hash *)allocator_local;
  }
  return index_hash_local;
}

Assistant:

extern LZMA_API(lzma_index_hash *)
lzma_index_hash_init(lzma_index_hash *index_hash,
		const lzma_allocator *allocator)
{
	if (index_hash == NULL) {
		index_hash = lzma_alloc(sizeof(lzma_index_hash), allocator);
		if (index_hash == NULL)
			return NULL;
	}

	index_hash->sequence = SEQ_BLOCK;
	index_hash->blocks.blocks_size = 0;
	index_hash->blocks.uncompressed_size = 0;
	index_hash->blocks.count = 0;
	index_hash->blocks.index_list_size = 0;
	index_hash->records.blocks_size = 0;
	index_hash->records.uncompressed_size = 0;
	index_hash->records.count = 0;
	index_hash->records.index_list_size = 0;
	index_hash->unpadded_size = 0;
	index_hash->uncompressed_size = 0;
	index_hash->pos = 0;
	index_hash->crc32 = 0;

	// These cannot fail because LZMA_CHECK_BEST is known to be supported.
	(void)lzma_check_init(&index_hash->blocks.check, LZMA_CHECK_BEST);
	(void)lzma_check_init(&index_hash->records.check, LZMA_CHECK_BEST);

	return index_hash;
}